

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

string * __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,unsigned_int,(glm::qualifier)0>>::
summaryString_abi_cxx11_(ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this)

{
  CanonicalDataSource CVar1;
  char *__lhs;
  long in_RSI;
  string *in_RDI;
  string *str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *in_stack_ffffffffffffff28;
  unsigned_long in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *in_stack_ffffffffffffff78;
  string local_68 [32];
  string local_48 [54];
  allocator local_12;
  undefined1 local_11;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  std::operator+(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff28,(char *)in_stack_ffffffffffffff20);
  std::__cxx11::string::operator+=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::operator+=((string *)in_RDI,"   status: ");
  CVar1 = ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::currentCanonicalDataSource
                    (in_stack_ffffffffffffff78);
  if (CVar1 == HostData) {
    std::__cxx11::string::operator+=((string *)in_RDI,"HostData");
  }
  else if (CVar1 == NeedsCompute) {
    std::__cxx11::string::operator+=((string *)in_RDI,"NeedsCompute");
  }
  else if (CVar1 == RenderBuffer) {
    std::__cxx11::string::operator+=((string *)in_RDI,"Renderbuffer");
  }
  __lhs = (char *)ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::size
                            (in_stack_ffffffffffffff28);
  std::__cxx11::to_string(in_stack_ffffffffffffff58);
  std::operator+(__lhs,in_stack_ffffffffffffff20);
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::__cxx11::string::operator+=((string *)in_RDI," device type: ");
  switch(*(undefined4 *)(in_RSI + 0x90)) {
  case 0:
    std::__cxx11::string::operator+=((string *)in_RDI,"Attribute");
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)in_RDI,"Texture1d");
    break;
  case 2:
    std::__cxx11::string::operator+=((string *)in_RDI,"Texture2d");
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)in_RDI,"Texture3d");
  }
  return in_RDI;
}

Assistant:

std::string ManagedBuffer<T>::summaryString() {

  std::string str = "";

  str += "[" + name + "]";
  str += "   status: ";
  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    str += "HostData";
    break;
  case CanonicalDataSource::NeedsCompute:
    str += "NeedsCompute";
    break;
  case CanonicalDataSource::RenderBuffer:
    str += "Renderbuffer";
    break;
  };
  str += " size: " + std::to_string(size());
  str += " device type: ";
  switch (deviceBufferType) {
  case DeviceBufferType::Attribute:
    str += "Attribute";
    break;
  case DeviceBufferType::Texture1d:
    str += "Texture1d";
    break;
  case DeviceBufferType::Texture2d:
    str += "Texture2d";
    break;
  case DeviceBufferType::Texture3d:
    str += "Texture3d";
    break;
  }

  return str;
}